

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

bool __thiscall QDecompressHelper::countInternal(QDecompressHelper *this,QByteDataBuffer *buffer)

{
  bool bVar1;
  QDecompressHelper *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool local_11;
  ContentEncoding in_stack_fffffffffffffff4;
  QDecompressHelper *this_00;
  
  this_00 = *(QDecompressHelper **)(in_FS_OFFSET + 0x28);
  if ((in_RDI->countDecompressed & 1U) == 0) {
    local_11 = true;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)
                       0x2a9412);
    if (!bVar1) {
      std::make_unique<QDecompressHelper>();
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator=
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)in_RDI,
                 (unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)
                 CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::~unique_ptr
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)in_RDI);
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator->
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)0x2a944b)
      ;
      setDecompressedSafetyCheckThreshold
                (in_RDI,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator->
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)0x2a946d)
      ;
      setEncoding(this_00,in_stack_fffffffffffffff4);
    }
    std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator->
              ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)0x2a948e);
    feed(in_RDI,(QByteDataBuffer *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    local_11 = countInternal(this);
  }
  if (*(QDecompressHelper **)(in_FS_OFFSET + 0x28) == this_00) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QDecompressHelper::countInternal(const QByteDataBuffer &buffer)
{
    if (countDecompressed) {
        if (!countHelper) {
            countHelper = std::make_unique<QDecompressHelper>();
            countHelper->setDecompressedSafetyCheckThreshold(archiveBombCheckThreshold);
            countHelper->setEncoding(contentEncoding);
        }
        countHelper->feed(buffer);
        return countInternal();
    }
    return true;
}